

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O1

int __thiscall
pele::physics::reactions::ReactorCvode::react
          (ReactorCvode *this,Box *box,Array4<double> *rY_in,Array4<double> *rYsrc_in,
          Array4<double> *T_in,Array4<double> *rEner_in,Array4<double> *rEner_src_in,
          Array4<double> *FC_in,Array4<int> *mask,Real *dt_react,Real *time)

{
  double dVar1;
  double dVar2;
  Real relTol;
  Real absTol;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *sundials_mem;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Context *sunctx;
  int i;
  int iVar17;
  int j;
  bool bVar18;
  Real CvodeActual_time_final;
  char local_230 [8];
  undefined1 local_228 [32];
  Long LStack_208;
  Dim3 local_200;
  int iStack_1f4;
  int iStack_1f0;
  undefined8 uStack_1ec;
  ReactorCvode *local_1e0;
  int local_1d8;
  bool local_1d4;
  double *local_1d0;
  Long LStack_1c8;
  Long local_1c0;
  Long LStack_1b8;
  Dim3 DStack_1b0;
  int local_1a4;
  int iStack_1a0;
  undefined8 uStack_19c;
  double *local_190;
  Long LStack_188;
  Long local_180;
  Long LStack_178;
  Dim3 DStack_170;
  int local_164;
  int iStack_160;
  undefined8 uStack_15c;
  double *local_150;
  Long LStack_148;
  Long local_140;
  Long LStack_138;
  Dim3 DStack_130;
  int local_124;
  int iStack_120;
  undefined8 uStack_11c;
  double *local_110;
  Long LStack_108;
  Long local_100;
  Long LStack_f8;
  Dim3 DStack_f0;
  int local_e4;
  int iStack_e0;
  undefined8 uStack_dc;
  double *local_d0;
  Long LStack_c8;
  Long local_c0;
  Long LStack_b8;
  Dim3 DStack_b0;
  int local_a4;
  int iStack_a0;
  undefined8 uStack_9c;
  double local_90;
  double local_88;
  int local_80;
  double *local_78;
  Long LStack_70;
  Long local_68;
  Long LStack_60;
  Dim3 DStack_58;
  int local_4c;
  int iStack_48;
  undefined8 uStack_44;
  Real local_38;
  
  dVar1 = *time;
  dVar2 = *dt_react;
  local_230[0] = '\0';
  local_230[1] = '\0';
  local_230[2] = '\0';
  local_230[3] = '\0';
  local_230[4] = '\0';
  local_230[5] = '\0';
  local_230[6] = '\0';
  local_230[7] = '\0';
  sunctx = amrex::sundials::The_Sundials_Context(0);
  sundials_mem = this->cvode_mem;
  iVar17 = this->udata_g->ncells;
  relTol = this->relTol;
  absTol = this->absTol;
  local_228._0_8_ = local_228 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"cvode","");
  ReactorBase::set_sundials_solver_tols
            ((ReactorBase *)this,sunctx,sundials_mem,iVar17,relTol,absTol,(string *)local_228);
  local_88 = dVar2 + dVar1;
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
  }
  local_1d8 = this->m_reactor_type;
  local_1d4 = this->m_clean_init_massfrac;
  local_228._0_8_ = local_230;
  local_228._8_8_ = mask->p;
  local_228._16_8_ = mask->jstride;
  local_228._24_8_ = mask->kstride;
  LStack_208 = mask->nstride;
  local_200.x = (mask->begin).x;
  local_200.y = (mask->begin).y;
  uVar8 = (mask->end).x;
  uVar9 = (mask->end).y;
  uStack_1ec = *(undefined8 *)&(mask->end).z;
  local_200.z = (int)*(undefined8 *)&(mask->begin).z;
  local_1d0 = rY_in->p;
  LStack_1c8 = rY_in->jstride;
  local_1c0 = rY_in->kstride;
  LStack_1b8 = rY_in->nstride;
  DStack_1b0.x = (rY_in->begin).x;
  DStack_1b0.y = (rY_in->begin).y;
  uVar10 = *(undefined8 *)&(rY_in->begin).z;
  uVar11 = (rY_in->end).y;
  uStack_19c = *(undefined8 *)&(rY_in->end).z;
  DStack_1b0.z = (int)uVar10;
  local_1a4 = (int)((ulong)uVar10 >> 0x20);
  local_190 = rYsrc_in->p;
  LStack_188 = rYsrc_in->jstride;
  local_180 = rYsrc_in->kstride;
  LStack_178 = rYsrc_in->nstride;
  DStack_170.x = (rYsrc_in->begin).x;
  DStack_170.y = (rYsrc_in->begin).y;
  uVar10 = *(undefined8 *)&(rYsrc_in->begin).z;
  uVar12 = (rYsrc_in->end).y;
  uStack_15c = *(undefined8 *)&(rYsrc_in->end).z;
  DStack_170.z = (int)uVar10;
  local_164 = (int)((ulong)uVar10 >> 0x20);
  local_150 = T_in->p;
  LStack_148 = T_in->jstride;
  local_140 = T_in->kstride;
  LStack_138 = T_in->nstride;
  DStack_130.x = (T_in->begin).x;
  DStack_130.y = (T_in->begin).y;
  uVar10 = *(undefined8 *)&(T_in->begin).z;
  uVar13 = (T_in->end).y;
  uStack_11c = *(undefined8 *)&(T_in->end).z;
  DStack_130.z = (int)uVar10;
  local_124 = (int)((ulong)uVar10 >> 0x20);
  local_110 = rEner_in->p;
  LStack_108 = rEner_in->jstride;
  local_100 = rEner_in->kstride;
  LStack_f8 = rEner_in->nstride;
  DStack_f0.x = (rEner_in->begin).x;
  DStack_f0.y = (rEner_in->begin).y;
  uVar10 = *(undefined8 *)&(rEner_in->begin).z;
  uVar14 = (rEner_in->end).y;
  uStack_dc = *(undefined8 *)&(rEner_in->end).z;
  DStack_f0.z = (int)uVar10;
  local_e4 = (int)((ulong)uVar10 >> 0x20);
  local_d0 = rEner_src_in->p;
  LStack_c8 = rEner_src_in->jstride;
  local_c0 = rEner_src_in->kstride;
  LStack_b8 = rEner_src_in->nstride;
  DStack_b0.x = (rEner_src_in->begin).x;
  DStack_b0.y = (rEner_src_in->begin).y;
  uVar10 = *(undefined8 *)&(rEner_src_in->begin).z;
  uVar15 = (rEner_src_in->end).y;
  uStack_9c = *(undefined8 *)&(rEner_src_in->end).z;
  DStack_b0.z = (int)uVar10;
  local_a4 = (int)((ulong)uVar10 >> 0x20);
  local_80 = 0;
  local_78 = FC_in->p;
  LStack_70 = FC_in->jstride;
  local_68 = FC_in->kstride;
  LStack_60 = FC_in->nstride;
  DStack_58.x = (FC_in->begin).x;
  DStack_58.y = (FC_in->begin).y;
  uVar10 = *(undefined8 *)&(FC_in->begin).z;
  uVar16 = (FC_in->end).y;
  uStack_44 = *(undefined8 *)&(FC_in->end).z;
  DStack_58.z = (int)uVar10;
  local_4c = (int)((ulong)uVar10 >> 0x20);
  local_38 = *dt_react;
  iVar17 = (box->smallend).vect[2];
  iVar3 = (box->bigend).vect[2];
  if (iVar17 <= iVar3) {
    iVar4 = (box->smallend).vect[0];
    iVar5 = (box->smallend).vect[1];
    iVar6 = (box->bigend).vect[0];
    iVar7 = (box->bigend).vect[1];
    iStack_1f4 = uVar8;
    iStack_1f0 = uVar9;
    local_1e0 = this;
    iStack_1a0 = uVar11;
    iStack_160 = uVar12;
    iStack_120 = uVar13;
    iStack_e0 = uVar14;
    iStack_a0 = uVar15;
    local_90 = dVar1;
    iStack_48 = uVar16;
    do {
      j = iVar5;
      if (iVar5 <= iVar7) {
        do {
          i = iVar4;
          if (iVar4 <= iVar6) {
            do {
              react::anon_class_504_15_883ac1a5::operator()
                        ((anon_class_504_15_883ac1a5 *)local_228,i,j,iVar17);
              i = i + 1;
            } while (iVar6 + 1 != i);
          }
          bVar18 = j != iVar7;
          j = j + 1;
        } while (bVar18);
      }
      bVar18 = iVar17 != iVar3;
      iVar17 = iVar17 + 1;
    } while (bVar18);
  }
  return 0x14;
}

Assistant:

int
ReactorCvode::react(
  const amrex::Box& box,
  amrex::Array4<amrex::Real> const& rY_in,
  amrex::Array4<amrex::Real> const& rYsrc_in,
  amrex::Array4<amrex::Real> const& T_in,
  amrex::Array4<amrex::Real> const& rEner_in,
  amrex::Array4<amrex::Real> const& rEner_src_in,
  amrex::Array4<amrex::Real> const& FC_in,
  amrex::Array4<int> const& mask,
  amrex::Real& dt_react,
  amrex::Real& time
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t stream
#endif
)
{
  BL_PROFILE("Pele::ReactorCvode::react()");

  // CPU and GPU version are very different such that the entire function
  // is split between a GPU region and a CPU region

  amrex::Real time_start = time;
  amrex::Real time_final = time + dt_react;
  amrex::Real CvodeActual_time_final = 0.0;

#ifdef SUNDIALS_BUILD_WITH_PROFILING
  SUNProfiler sun_profiler = nullptr;
  SUNContext_GetProfiler(
    *amrex::sundials::The_Sundials_Context(), &sun_profiler);
  // SUNProfiler_Reset(sun_profiler);
#endif

  //----------------------------------------------------------
  // GPU Region
  //----------------------------------------------------------
#ifdef AMREX_USE_GPU
  const int ncells = box.numPts();
  const int neq_tot = (NUM_SPECIES + 1) * ncells;

  // Solution vector and execution policy
  auto y = utils::setNVectorGPU(neq_tot, atomic_reductions, stream);

  // Solution data array
  amrex::Real* yvec_d = N_VGetDeviceArrayPointer(y);

  amrex::Gpu::streamSynchronize();
  SUNMatrix A = nullptr;
  CVODEUserData* user_data = new CVODEUserData{};
  allocUserData(user_data, ncells, A, stream);

  // Fill data
  flatten(
    box, ncells, rY_in, rYsrc_in, T_in, rEner_in, rEner_src_in, yvec_d,
    user_data->rYsrc_ext, user_data->rhoe_init, user_data->rhoesrc_ext);

#ifdef AMREX_USE_OMP
  amrex::Gpu::Device::streamSynchronize();
#endif

  // Setup Cvode object
  void* cvode_mem =
    CVodeCreate(CV_BDF, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(cvode_mem, "CVodeCreate", 0))
    return (1);
  int flag = CVodeSetUserData(cvode_mem, static_cast<void*>(user_data));

  // Call CVodeInit to initialize the integrator memory and specify the user's
  // right hand side function, the inital time, and initial dependent variable
  // vector y.
  flag = CVodeInit(cvode_mem, cF_RHS, time_start, y);
  if (utils::check_flag(&flag, "CVodeInit", 1))
    return (1);

  // Setup tolerances with typical values
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, user_data->ncells,
    relTol, absTol, "cvode");

  // Solver data
  SUNNonlinearSolver NLS = nullptr;
  SUNLinearSolver LS = nullptr;
  if (user_data->solve_type == cvode::fixedPoint) {
    NLS = SUNNonlinSol_FixedPoint(
      y, max_fp_accel, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(NLS), "SUNNonlinSol_FixedPoint", 0)) {
      return (1);
    }

    flag = CVodeSetNonlinearSolver(cvode_mem, NLS);
    if (utils::check_flag(&flag, "CVodeSetNonlinearSolver", 1)) {
      return (1);
    }
  } else if (user_data->solve_type == cvode::sparseDirect) {
#if defined(AMREX_USE_CUDA)
    LS = SUNLinSol_cuSolverSp_batchQR(
      y, A, user_data->cusolverHandle,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(LS), "SUNLinSol_cuSolverSp_batchQR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
#else
    amrex::Abort(
      "Shoudn't be there. solve_type sparse_direct only available with CUDA");
#endif
  } else if (user_data->solve_type == cvode::customDirect) {
#if defined(AMREX_USE_CUDA)
    LS = cvode::SUNLinSol_dense_custom(
      y, A, stream, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_dense_custom", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
    flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
    if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
      return (1);
#else
    amrex::Abort(
      "Shoudn't be there. solve_type custom_direct only available with CUDA");
#endif
  } else if (user_data->solve_type == cvode::magmaDirect) {
#ifdef PELE_USE_MAGMA
    LS = SUNLinSol_MagmaDense(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_MagmaDense", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
#else
    amrex::Abort(
      "Shoudn't be there. solve_type magma_direct only available with "
      "PELE_USE_MAGMA = TRUE");
#endif
  } else if (user_data->solve_type == cvode::GMRES) {
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_NONE, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
  } else if (user_data->solve_type == cvode::precGMRES) {
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_LEFT, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
  }

  // Analytical Jac. data for direct solver
  // Sparse/custom/magma direct uses the same Jacobian functions
  if (user_data->analytical_jacobian == 1) {
    flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
    if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
      return (1);
  }

  // Analytical Jac. data for iterative solver preconditioner
  if (user_data->precond_type == cvode::sparseSimpleAJac) {
    flag = CVodeSetPreconditioner(cvode_mem, cvode::Precond, cvode::PSolve);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1))
      return (1);
  }

  // CVODE runtime options
  flag = CVodeSetMaxNonlinIters(cvode_mem, max_nls_iters);
  if (utils::check_flag(&flag, "CVodeSetMaxNonlinIters", 1))
    return (1);
  flag = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (utils::check_flag(&flag, "CVodeSetMaxNumSteps", 1))
    return (1);
  flag = CVodeSetMaxOrd(cvode_mem, user_data->maxOrder);
  if (utils::check_flag(&flag, "CVodeSetMaxOrd", 1))
    return (1);

  // Actual CVODE solve
  BL_PROFILE_VAR("Pele::ReactorCvode::react():CVode", AroundCVODE);
  flag = CVode(cvode_mem, time_final, y, &CvodeActual_time_final, CV_NORMAL);
  if (utils::check_flag(&flag, "CVode", 1))
    return (1);
  BL_PROFILE_VAR_STOP(AroundCVODE);

#ifdef MOD_REACTOR
  dt_react =
    time_start - CvodeActual_time_final; // Actual dt_react performed by Cvode
  time += dt_react;                      // Increment time in reactor mode
#endif

#ifdef AMREX_USE_OMP
  amrex::Gpu::Device::streamSynchronize();
#endif

  // Get workload estimate
  long int nfe;
  flag = CVodeGetNumRhsEvals(cvode_mem, &nfe);

  amrex::Gpu::DeviceVector<long int> v_nfe(ncells, nfe);
  long int* d_nfe = v_nfe.data();
  unflatten(
    box, ncells, rY_in, T_in, rEner_in, rEner_src_in, FC_in, yvec_d,
    user_data->rhoe_init, d_nfe, dt_react);

  if (user_data->verbose > 1) {
    print_final_stats(cvode_mem, LS != nullptr);
  }

  // Clean up
  N_VDestroy(y);
  CVodeFree(&cvode_mem);
  if (LS != nullptr) {
    SUNLinSolFree(LS);
  }
  if (NLS != nullptr) {
    SUNNonlinSolFree(NLS);
  }
  if (A != nullptr) {
    SUNMatDestroy(A);
  }
  freeUserData(user_data);

#else
  //----------------------------------------------------------
  // CPU Region
  //----------------------------------------------------------

  int omp_thread = 0;
#ifdef AMREX_USE_OMP
  omp_thread = omp_get_thread_num();
#endif

  // Update TypicalValues
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, udata_g->ncells,
    relTol, absTol, "cvode");

  // Perform integration one cell at a time
  const int icell = 0;
  const int ncells = 1;
  const auto captured_reactor_type = m_reactor_type;
  const auto captured_clean_init_massfrac = m_clean_init_massfrac;
  ParallelFor(
    box, [=, &CvodeActual_time_final] AMREX_GPU_DEVICE(
           int i, int j, int k) noexcept {
      if (mask(i, j, k) != -1) {

        amrex::Real* yvec_d = N_VGetArrayPointer(y);
        utils::box_flatten<Ordering>(
          icell, i, j, k, ncells, captured_reactor_type,
          captured_clean_init_massfrac, rY_in, rYsrc_in, T_in, rEner_in,
          rEner_src_in, yvec_d, udata_g->rYsrc_ext, udata_g->rhoe_init,
          udata_g->rhoesrc_ext);

        // ReInit CVODE is faster
        CVodeReInit(cvode_mem, time_start, y);

        BL_PROFILE_VAR("Pele::ReactorCvode::react():CVode", AroundCVODE);
        CVode(cvode_mem, time_final, y, &CvodeActual_time_final, CV_NORMAL);
        BL_PROFILE_VAR_STOP(AroundCVODE);

        // cppcheck-suppress knownConditionTrueFalse
        if ((udata_g->verbose > 1) && (omp_thread == 0)) {
          amrex::Print() << "Additional verbose info --\n";
          print_final_stats(cvode_mem, LS != nullptr);
          amrex::Print() << "\n -------------------------------------\n";
        }

        amrex::Real actual_dt = CvodeActual_time_final - time_start;

        // Get estimate of how hard the integration process was
        long int nfe = 0;
        long int nfeLS = 0;
        CVodeGetNumRhsEvals(cvode_mem, &nfe);
        if (LS != nullptr) {
          CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
        }
        const long int nfe_tot = nfe + nfeLS;

        utils::box_unflatten<Ordering>(
          icell, i, j, k, ncells, captured_reactor_type,
          captured_clean_init_massfrac, rY_in, T_in, rEner_in, rEner_src_in,
          FC_in, yvec_d, udata_g->rhoe_init, nfe_tot, dt_react);

        // cppcheck-suppress knownConditionTrueFalse
        if ((udata_g->verbose > 3) && (omp_thread == 0)) {
          amrex::Print() << "END : time curr is " << CvodeActual_time_final
                         << " and actual dt_react is " << actual_dt << "\n";
        }
      } else {
        FC_in(i, j, k, 0) = 0.0;
      }